

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_fourier_transform.cc
# Opt level: O1

bool __thiscall
sptk::DiscreteFourierTransform::Run
          (DiscreteFourierTransform *this,vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  ulong uVar12;
  bool bVar13;
  size_type __new_size;
  ulong uVar14;
  long lVar15;
  int n;
  long lVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  
  if (this->is_valid_ == true) {
    __new_size = (size_type)this->dft_length_;
    if ((long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == __new_size) {
      bVar13 = false;
      if (((imag_part_output != (vector<double,_std::allocator<double>_> *)0x0) &&
          (bVar13 = false, real_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
         ((long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 == __new_size)) {
        if ((long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != __new_size) {
          std::vector<double,_std::allocator<double>_>::resize(real_part_output,__new_size);
        }
        if ((long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3 != (long)this->dft_length_) {
          std::vector<double,_std::allocator<double>_>::resize
                    (imag_part_output,(long)this->dft_length_);
        }
        uVar5 = this->dft_length_;
        lVar15 = (long)(int)uVar5;
        bVar13 = true;
        if (0 < lVar15) {
          pdVar6 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar11 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar17 = 0;
          do {
            dVar18 = 0.0;
            dVar19 = 0.0;
            uVar14 = 0;
            lVar16 = 0;
            do {
              uVar12 = uVar14 % (ulong)uVar5;
              dVar1 = pdVar7[lVar16];
              dVar2 = pdVar11[uVar12];
              dVar3 = pdVar10[uVar12];
              dVar4 = pdVar6[lVar16];
              dVar18 = dVar18 + dVar2 * dVar4 + -dVar1 * dVar3;
              dVar19 = dVar19 + dVar3 * dVar4 + dVar1 * dVar2;
              lVar16 = lVar16 + 1;
              uVar14 = (ulong)(uint)((int)uVar14 + (int)lVar17);
            } while (lVar15 != lVar16);
            pdVar8[lVar17] = dVar18;
            pdVar9[lVar17] = dVar19;
            lVar17 = lVar17 + 1;
          } while (lVar17 != lVar15);
        }
      }
    }
    else {
      bVar13 = false;
    }
  }
  else {
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool DiscreteFourierTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output) const {
  // Check inputs
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(dft_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dft_length_) ||
      NULL == real_part_output || NULL == imag_part_output) {
    return false;
  }

  // Prepare memories.
  if (real_part_output->size() != static_cast<std::size_t>(dft_length_)) {
    real_part_output->resize(dft_length_);
  }
  if (imag_part_output->size() != static_cast<std::size_t>(dft_length_)) {
    imag_part_output->resize(dft_length_);
  }

  const double* input_x(&(real_part_input[0]));
  const double* input_y(&(imag_part_input[0]));
  double* output_x(&((*real_part_output)[0]));
  double* output_y(&((*imag_part_output)[0]));

  for (int k(0); k < dft_length_; ++k) {
    double sum_x(0.0);
    double sum_y(0.0);
    for (int n(0); n < dft_length_; ++n) {
      const int index(k * n % dft_length_);
      sum_x +=
          input_x[n] * cosine_table_[index] - input_y[n] * sine_table_[index];
      sum_y +=
          input_x[n] * sine_table_[index] + input_y[n] * cosine_table_[index];
    }
    output_x[k] = sum_x;
    output_y[k] = sum_y;
  }

  return true;
}